

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::GenTypeSize_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,Type *type)

{
  bool bVar1;
  allocator<char> local_21;
  Type *local_20;
  Type *type_local;
  CppGenerator *this_local;
  
  local_20 = type;
  type_local = (Type *)this;
  this_local = (CppGenerator *)__return_storage_ptr__;
  bVar1 = IsScalar(type->base_type);
  if (bVar1) {
    GenTypeBasic_abi_cxx11_(__return_storage_ptr__,this,local_20,false);
  }
  else {
    bVar1 = IsStruct(local_20);
    if (bVar1) {
      GenTypePointer_abi_cxx11_(__return_storage_ptr__,this,local_20);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"::flatbuffers::uoffset_t",&local_21);
      std::allocator<char>::~allocator(&local_21);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenTypeSize(const Type &type) const {
    if (IsScalar(type.base_type)) {
      return GenTypeBasic(type, false);
    } else if (IsStruct(type)) {
      return GenTypePointer(type);
    } else {
      return "::flatbuffers::uoffset_t";
    }
  }